

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h2h3.c
# Opt level: O0

CURLcode Curl_pseudo_headers(Curl_easy *data,char *mem,size_t len,h2h3req **hp)

{
  connectdata *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  int iVar5;
  header_instruction hVar6;
  h2h3pseudo *phVar7;
  char *pcVar8;
  size_t sVar9;
  h2h3pseudo *phVar10;
  h2h3pseudo *phVar11;
  bool bVar12;
  ulong local_b0;
  size_t acc;
  h2h3pseudo authority;
  size_t hlen;
  char *vptr;
  h2h3req *hreq;
  h2h3pseudo *nva;
  char *line_end;
  char *end;
  char *hdbuf;
  size_t authority_idx;
  size_t i;
  size_t nheader;
  connectdata *conn;
  h2h3req **hp_local;
  size_t len_local;
  char *mem_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  i = 0;
  vptr = (char *)0x0;
  for (authority_idx = 1; authority_idx < len; authority_idx = authority_idx + 1) {
    if ((mem[authority_idx] == '\n') && (mem[authority_idx - 1] == '\r')) {
      i = i + 1;
      authority_idx = authority_idx + 1;
    }
  }
  if (1 < i) {
    vptr = (char *)(*Curl_cmalloc)(i * 0x20 + 0x28);
    if ((h2h3req *)vptr != (h2h3req *)0x0) {
      phVar7 = ((h2h3req *)vptr)->header;
      nva = (h2h3pseudo *)memchr(mem,0xd,len);
      if (((nva != (h2h3pseudo *)0x0) &&
          (pcVar8 = (char *)memchr(mem,0x20,(long)nva - (long)mem), pcVar8 != (char *)0x0)) &&
         (pcVar8 != mem)) {
        phVar7->name = ":method";
        ((h2h3req *)vptr)->header[0].namelen = 7;
        ((h2h3req *)vptr)->header[0].value = mem;
        ((h2h3req *)vptr)->header[0].valuelen = (long)pcVar8 - (long)mem;
        pcVar8 = pcVar8 + 1;
        line_end = (char *)0x0;
        for (authority_idx = (long)nva - (long)pcVar8; authority_idx != 0;
            authority_idx = authority_idx - 1) {
          if (pcVar8[authority_idx - 1] == ' ') {
            line_end = pcVar8 + (authority_idx - 1);
            break;
          }
        }
        if ((line_end != (char *)0x0) && (line_end != pcVar8)) {
          ((h2h3req *)((long)vptr + 0x28))->entries = (size_t)":path";
          ((h2h3req *)((long)vptr + 0x28))->header[0].name = (char *)0x5;
          ((h2h3req *)((long)vptr + 0x28))->header[0].namelen = (size_t)pcVar8;
          ((h2h3req *)((long)vptr + 0x28))->header[0].value = line_end + -(long)pcVar8;
          ((h2h3req *)((long)vptr + 0x28))->header[0].valuelen = (size_t)":scheme";
          ((h2h3req *)((long)vptr + 0x50))->entries = 7;
          pcVar8 = Curl_checkheaders(data,":scheme",7);
          if (pcVar8 == (char *)0x0) {
            if ((pcVar1->handler->flags & 1) == 0) {
              ((h2h3req *)((long)vptr + 0x50))->header[0].name = "http";
            }
            else {
              ((h2h3req *)((long)vptr + 0x50))->header[0].name = "https";
            }
          }
          else {
            hlen = (size_t)(pcVar8 + 8);
            while( true ) {
              bVar12 = false;
              if ((*(char *)hlen != '\0') && (bVar12 = true, *(char *)hlen != ' ')) {
                bVar12 = *(char *)hlen == '\t';
              }
              if (!bVar12) break;
              hlen = hlen + 1;
            }
            ((h2h3req *)((long)vptr + 0x50))->header[0].name = (char *)hlen;
            Curl_infof(data,"set pseudo header %s to %s",":scheme",hlen);
          }
          sVar9 = strlen(((h2h3req *)((long)vptr + 0x50))->header[0].name);
          ((h2h3req *)((long)vptr + 0x50))->header[0].namelen = sVar9;
          hdbuf = (char *)0x0;
          authority_idx = 3;
          i = i + 1;
          while( true ) {
            if (i <= authority_idx) {
              if ((hdbuf != (char *)0x0) && (hdbuf != (char *)0x3)) {
                phVar10 = phVar7 + (long)hdbuf;
                pcVar8 = phVar10->name;
                sVar2 = phVar10->namelen;
                pcVar3 = phVar10->value;
                sVar4 = phVar10->valuelen;
                for (authority_idx = (size_t)hdbuf; 3 < authority_idx;
                    authority_idx = authority_idx - 1) {
                  phVar10 = phVar7 + authority_idx;
                  phVar11 = phVar7 + (authority_idx - 1);
                  phVar10->name = phVar11->name;
                  phVar10->namelen = phVar11->namelen;
                  phVar10->value = phVar11->value;
                  phVar10->valuelen = phVar11->valuelen;
                }
                phVar10 = phVar7 + authority_idx;
                phVar10->name = pcVar8;
                phVar10->namelen = sVar2;
                phVar10->value = pcVar3;
                phVar10->valuelen = sVar4;
              }
              local_b0 = 0;
              for (authority_idx = 0; authority_idx < i; authority_idx = authority_idx + 1) {
                local_b0 = phVar7[authority_idx].namelen + phVar7[authority_idx].valuelen + local_b0
                ;
                Curl_infof(data,"h2h3 [%.*s: %.*s]",phVar7[authority_idx].namelen & 0xffffffff,
                           phVar7[authority_idx].name,phVar7[authority_idx].valuelen & 0xffffffff,
                           phVar7[authority_idx].value);
              }
              if (60000 < local_b0) {
                Curl_infof(data,
                           "http_request: Warning: The cumulative length of all headers exceeds %d bytes and that could cause the stream to be rejected."
                           ,60000);
              }
              ((h2h3req *)vptr)->entries = i;
              *hp = (h2h3req *)vptr;
              return CURLE_OK;
            }
            phVar10 = (h2h3pseudo *)((long)&nva->name + 2);
            nva = (h2h3pseudo *)memchr(phVar10,0xd,len - ((long)phVar10 - (long)mem));
            if ((((nva == (h2h3pseudo *)0x0) || (nva == phVar10)) ||
                (*(char *)&phVar10->name == ' ')) ||
               (line_end = (char *)phVar10, *(char *)&phVar10->name == '\t')) break;
            while( true ) {
              bVar12 = false;
              if (line_end < nva) {
                bVar12 = *line_end != ':';
              }
              if (!bVar12) break;
              line_end = line_end + 1;
            }
            if (((h2h3pseudo *)line_end == phVar10) || ((h2h3pseudo *)line_end == nva)) break;
            if (((long)line_end - (long)phVar10 == 4) &&
               (iVar5 = Curl_strncasecompare("host",(char *)phVar10,4), iVar5 != 0)) {
              hdbuf = (char *)authority_idx;
              phVar7[authority_idx].name = ":authority";
              phVar7[authority_idx].namelen = 10;
            }
            else {
              phVar7[authority_idx].namelen = (long)line_end - (long)phVar10;
              Curl_strntolower((char *)phVar10,(char *)phVar10,phVar7[authority_idx].namelen);
              phVar7[authority_idx].name = (char *)phVar10;
            }
            do {
              end = line_end + 1;
              bVar12 = true;
              if (*end != ' ') {
                bVar12 = *end == '\t';
              }
              line_end = end;
            } while (bVar12);
            hVar6 = inspect_header(phVar7[authority_idx].name,
                                   ((h2h3req *)vptr)->header[authority_idx].namelen,end,
                                   (long)nva - (long)end);
            if (hVar6 == HEADERINST_IGNORE) {
              i = i - 1;
            }
            else {
              if (hVar6 == HEADERINST_TE_TRAILERS) {
                phVar7[authority_idx].value = "trailers";
                phVar7[authority_idx].valuelen = 8;
              }
              else {
                phVar7[authority_idx].value = end;
                phVar7[authority_idx].valuelen = (long)nva - (long)end;
              }
              authority_idx = authority_idx + 1;
            }
          }
        }
      }
    }
  }
  (*Curl_cfree)(vptr);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_pseudo_headers(struct Curl_easy *data,
                             const char *mem, /* the request */
                             const size_t len /* size of request */,
                             struct h2h3req **hp)
{
  struct connectdata *conn = data->conn;
  size_t nheader = 0;
  size_t i;
  size_t authority_idx;
  char *hdbuf = (char *)mem;
  char *end, *line_end;
  struct h2h3pseudo *nva = NULL;
  struct h2h3req *hreq = NULL;
  char *vptr;

  /* Calculate number of headers contained in [mem, mem + len). Assumes a
     correctly generated HTTP header field block. */
  for(i = 1; i < len; ++i) {
    if(hdbuf[i] == '\n' && hdbuf[i - 1] == '\r') {
      ++nheader;
      ++i;
    }
  }
  if(nheader < 2) {
    goto fail;
  }
  /* We counted additional 2 \r\n in the first and last line. We need 3
     new headers: :method, :path and :scheme. Therefore we need one
     more space. */
  nheader += 1;
  hreq = malloc(sizeof(struct h2h3req) +
                sizeof(struct h2h3pseudo) * (nheader - 1));
  if(!hreq) {
    goto fail;
  }

  nva = &hreq->header[0];

  /* Extract :method, :path from request line
     We do line endings with CRLF so checking for CR is enough */
  line_end = memchr(hdbuf, '\r', len);
  if(!line_end) {
    goto fail;
  }

  /* Method does not contain spaces */
  end = memchr(hdbuf, ' ', line_end - hdbuf);
  if(!end || end == hdbuf)
    goto fail;
  nva[0].name = H2H3_PSEUDO_METHOD;
  nva[0].namelen = sizeof(H2H3_PSEUDO_METHOD) - 1;
  nva[0].value = hdbuf;
  nva[0].valuelen = (size_t)(end - hdbuf);

  hdbuf = end + 1;

  /* Path may contain spaces so scan backwards */
  end = NULL;
  for(i = (size_t)(line_end - hdbuf); i; --i) {
    if(hdbuf[i - 1] == ' ') {
      end = &hdbuf[i - 1];
      break;
    }
  }
  if(!end || end == hdbuf)
    goto fail;
  nva[1].name = H2H3_PSEUDO_PATH;
  nva[1].namelen = sizeof(H2H3_PSEUDO_PATH) - 1;
  nva[1].value = hdbuf;
  nva[1].valuelen = (end - hdbuf);

  nva[2].name = H2H3_PSEUDO_SCHEME;
  nva[2].namelen = sizeof(H2H3_PSEUDO_SCHEME) - 1;
  vptr = Curl_checkheaders(data, STRCONST(H2H3_PSEUDO_SCHEME));
  if(vptr) {
    vptr += sizeof(H2H3_PSEUDO_SCHEME);
    while(*vptr && ISBLANK(*vptr))
      vptr++;
    nva[2].value = vptr;
    infof(data, "set pseudo header %s to %s", H2H3_PSEUDO_SCHEME, vptr);
  }
  else {
    if(conn->handler->flags & PROTOPT_SSL)
      nva[2].value = "https";
    else
      nva[2].value = "http";
  }
  nva[2].valuelen = strlen((char *)nva[2].value);

  authority_idx = 0;
  i = 3;
  while(i < nheader) {
    size_t hlen;

    hdbuf = line_end + 2;

    /* check for next CR, but only within the piece of data left in the given
       buffer */
    line_end = memchr(hdbuf, '\r', len - (hdbuf - (char *)mem));
    if(!line_end || (line_end == hdbuf))
      goto fail;

    /* header continuation lines are not supported */
    if(*hdbuf == ' ' || *hdbuf == '\t')
      goto fail;

    for(end = hdbuf; end < line_end && *end != ':'; ++end)
      ;
    if(end == hdbuf || end == line_end)
      goto fail;
    hlen = end - hdbuf;

    if(hlen == 4 && strncasecompare("host", hdbuf, 4)) {
      authority_idx = i;
      nva[i].name = H2H3_PSEUDO_AUTHORITY;
      nva[i].namelen = sizeof(H2H3_PSEUDO_AUTHORITY) - 1;
    }
    else {
      nva[i].namelen = (size_t)(end - hdbuf);
      /* Lower case the header name for HTTP/3 */
      Curl_strntolower((char *)hdbuf, hdbuf, nva[i].namelen);
      nva[i].name = hdbuf;
    }
    hdbuf = end + 1;
    while(*hdbuf == ' ' || *hdbuf == '\t')
      ++hdbuf;
    end = line_end;

    switch(inspect_header((const char *)nva[i].name, nva[i].namelen, hdbuf,
                          end - hdbuf)) {
    case HEADERINST_IGNORE:
      /* skip header fields prohibited by HTTP/2 specification. */
      --nheader;
      continue;
    case HEADERINST_TE_TRAILERS:
      nva[i].value = "trailers";
      nva[i].valuelen = sizeof("trailers") - 1;
      break;
    default:
      nva[i].value = hdbuf;
      nva[i].valuelen = (end - hdbuf);
    }

    ++i;
  }

  /* :authority must come before non-pseudo header fields */
  if(authority_idx && authority_idx != AUTHORITY_DST_IDX) {
    struct h2h3pseudo authority = nva[authority_idx];
    for(i = authority_idx; i > AUTHORITY_DST_IDX; --i) {
      nva[i] = nva[i - 1];
    }
    nva[i] = authority;
  }

  /* Warn stream may be rejected if cumulative length of headers is too
     large. */
#define MAX_ACC 60000  /* <64KB to account for some overhead */
  {
    size_t acc = 0;

    for(i = 0; i < nheader; ++i) {
      acc += nva[i].namelen + nva[i].valuelen;

      infof(data, "h2h3 [%.*s: %.*s]",
            (int)nva[i].namelen, nva[i].name,
            (int)nva[i].valuelen, nva[i].value);
    }

    if(acc > MAX_ACC) {
      infof(data, "http_request: Warning: The cumulative length of all "
            "headers exceeds %d bytes and that could cause the "
            "stream to be rejected.", MAX_ACC);
    }
  }

  hreq->entries = nheader;
  *hp = hreq;

  return CURLE_OK;

  fail:
  free(hreq);
  return CURLE_OUT_OF_MEMORY;
}